

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cc
# Opt level: O3

EvalBResults parser::Evaluate(string *ref_fname,string *hyp_fname)

{
  long lVar1;
  char cVar2;
  int iVar3;
  long *plVar4;
  ostream *poVar5;
  FILE *__stream;
  istream *piVar6;
  _func_int **pp_Var7;
  long *plVar8;
  undefined8 uVar9;
  float in_XMM1_Da;
  EvalBResults EVar10;
  string cmd;
  string line;
  stream_buffer<boost::iostreams::file_descriptor_source,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::input_seekable>
  fpstream;
  istream in;
  long *local_210;
  long local_200;
  long lStack_1f8;
  undefined8 local_1f0;
  long local_1e8;
  char local_1e0 [16];
  stream_buffer<boost::iostreams::file_descriptor_source,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::input_seekable>
  local_1d0;
  undefined1 local_148 [16];
  _func_int *local_138;
  long lStack_130;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0,
                 "echo ",ref_fname);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  pp_Var7 = (_func_int **)(plVar4 + 2);
  if ((_func_int **)*plVar4 == pp_Var7) {
    local_138 = *pp_Var7;
    lStack_130 = plVar4[3];
    local_148._0_8_ = &local_138;
  }
  else {
    local_138 = *pp_Var7;
    local_148._0_8_ = (_func_int **)*plVar4;
  }
  local_148._8_8_ = plVar4[1];
  *plVar4 = (long)pp_Var7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append(local_148,(ulong)(hyp_fname->_M_dataplus)._M_p);
  local_210 = &local_200;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_200 = *plVar8;
    lStack_1f8 = plVar4[3];
  }
  else {
    local_200 = *plVar8;
    local_210 = (long *)*plVar4;
  }
  lVar1 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((_func_int **)local_148._0_8_ != &local_138) {
    operator_delete((void *)local_148._0_8_);
  }
  if ((undefined1 *)local_1d0.super_type.super_linked_streambuf<char,_std::char_traits<char>_>._0_8_
      != &local_1d0.super_type.super_linked_streambuf<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete((void *)local_1d0.super_type.
                            super_linked_streambuf<char,_std::char_traits<char>_>._0_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"COMMAND: ",9);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)local_210,lVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  __stream = popen((char *)local_210,"r");
  iVar3 = fileno(__stream);
  local_148._0_4_ = iVar3;
  local_1f0 = (char *)((ulong)local_1f0._4_4_ << 0x20);
  boost::iostreams::
  stream_buffer<boost::iostreams::file_descriptor_source,std::char_traits<char>,std::allocator<char>,boost::iostreams::input_seekable>
  ::stream_buffer<int,boost::iostreams::file_descriptor_flags>
            ((stream_buffer<boost::iostreams::file_descriptor_source,std::char_traits<char>,std::allocator<char>,boost::iostreams::input_seekable>
              *)&local_1d0,(int *)local_148,(file_descriptor_flags *)&local_1f0,(type *)0x0);
  std::istream::istream((istream *)local_148,(streambuf *)&local_1d0);
  local_1f0 = local_1e0;
  local_1e8 = 0;
  local_1e0[0] = '\0';
  while( true ) {
    cVar2 = std::ios::widen((char)*(_func_int **)(local_148._0_8_ + -0x18) +
                            (char)(istream *)local_148);
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_148,(string *)&local_1f0,cVar2);
    if (((&piVar6->field_0x20)[(long)piVar6->_vptr_basic_istream[-3]] & 5) != 0) break;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Got line: ",10);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_1f0,local_1e8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  fclose(__stream);
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0);
  }
  local_148._0_8_ = _VTT;
  *(undefined8 *)(local_148 + (long)_VTT[-3]) = _vtable;
  local_148._8_8_ = 0;
  uVar9 = std::ios_base::~ios_base((ios_base *)&local_138);
  boost::iostreams::
  stream_buffer<boost::iostreams::file_descriptor_source,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::input_seekable>
  ::~stream_buffer(&local_1d0);
  if (local_210 != &local_200) {
    operator_delete(local_210);
  }
  EVar10.f = in_XMM1_Da;
  EVar10.p = (float)(int)uVar9;
  EVar10.r = (float)(int)((ulong)uVar9 >> 0x20);
  return EVar10;
}

Assistant:

EvalBResults Evaluate(const string& ref_fname, const string& hyp_fname) {
  string cmd = "echo " + ref_fname + " " + hyp_fname;
  cerr << "COMMAND: " << cmd << endl;
  FILE *pipe = popen(cmd.c_str(), "r");
  io::stream_buffer<io::file_descriptor_source> fpstream (fileno(pipe), io::never_close_handle);
  istream in(&fpstream);
  string line;
  while(getline(in, line)) {
    cerr << "Got line: " << line << endl;
  }
  fclose(pipe);
  EvalBResults r;
  return r;
}